

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O1

void __thiscall
duckdb::ColumnReader::DirectSelect
          (ColumnReader *this,uint64_t num_values,data_ptr_t define_out,data_ptr_t repeat_out,
          Vector *result,SelectionVector *sel,idx_t approved_tuple_count)

{
  bool bVar1;
  ulong read_now;
  
  BeginRead(this,define_out,repeat_out);
  while (read_now = this->page_rows_available, read_now == 0) {
    PrepareRead(this,(optional_ptr<const_duckdb::TableFilter,_true>)0x0,
                (optional_ptr<duckdb::TableFilterState,_true>)0x0);
  }
  if (num_values < read_now) {
    read_now = num_values;
  }
  if (0x7ff < read_now) {
    read_now = 0x800;
  }
  if ((read_now == num_values) && (this->encoding == PLAIN)) {
    bVar1 = PrepareRead(this,read_now,define_out,repeat_out,0);
    if (bVar1) {
      define_out = (data_ptr_t)0x0;
    }
    (*this->_vptr_ColumnReader[0x10])
              (this,&this->block,define_out,read_now,result,sel,approved_tuple_count);
    this->page_rows_available = this->page_rows_available - read_now;
    FinishRead(this,num_values);
    return;
  }
  ReadInternal(this,num_values,define_out,repeat_out,result);
  return;
}

Assistant:

void ColumnReader::DirectSelect(uint64_t num_values, data_ptr_t define_out, data_ptr_t repeat_out, Vector &result,
                                const SelectionVector &sel, idx_t approved_tuple_count) {
	auto to_read = num_values;

	// prepare the first read if we haven't yet
	BeginRead(define_out, repeat_out);
	auto read_now = ReadPageHeaders(num_values);

	// we can only push the filter into the decoder if we are reading the ENTIRE vector in one go
	if (read_now == to_read && encoding == ColumnEncoding::PLAIN) {
		const auto all_valid = PrepareRead(read_now, define_out, repeat_out, 0);
		const auto define_ptr = all_valid ? nullptr : static_cast<uint8_t *>(define_out);
		PlainSelect(block, define_ptr, read_now, result, sel, approved_tuple_count);

		page_rows_available -= read_now;
		FinishRead(num_values);
		return;
	}
	// fallback to regular read + filter
	ReadInternal(num_values, define_out, repeat_out, result);
}